

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

uc_err reg_write_m68k(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  CPUM68KState *env;
  
  if (regid - 1 < 8) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)((long)_env + (ulong)(regid - 1) * 4 + 0x20) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 9 < 8) {
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)((long)_env + (ulong)(regid - 9) * 4) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid == 0x11) {
    if (3 < *size) {
      *size = 4;
      cpu_m68k_set_sr_m68k((CPUM68KState_conflict *)_env,*value);
      return UC_ERR_OK;
    }
  }
  else {
    if (regid != 0x12) {
      return UC_ERR_ARG;
    }
    if (3 < *size) {
      *size = 4;
      *(undefined4 *)((long)_env + 0x40) = *value;
      *setpc = 1;
      return UC_ERR_OK;
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUM68KState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_M68K_REG_A0 && regid <= UC_M68K_REG_A7) {
        CHECK_REG_TYPE(uint32_t);
        env->aregs[regid - UC_M68K_REG_A0] = *(uint32_t *)value;
    } else if (regid >= UC_M68K_REG_D0 && regid <= UC_M68K_REG_D7) {
        CHECK_REG_TYPE(uint32_t);
        env->dregs[regid - UC_M68K_REG_D0] = *(uint32_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_M68K_REG_PC:
            CHECK_REG_TYPE(uint32_t);
            env->pc = *(uint32_t *)value;
            *setpc = 1;
            break;
        case UC_M68K_REG_SR:
            CHECK_REG_TYPE(uint32_t);
            cpu_m68k_set_sr(env, *(uint32_t *)value);
            break;
        }
    }

    return ret;
}